

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O3

ParamGenerator<(anonymous_namespace)::TestVideoParam>
testing::ValuesIn<(anonymous_namespace)::TestVideoParam,9ul>
          (anon_struct_24_5_c1269b3d_for__M_head_impl (*array) [9])

{
  ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam> *impl;
  _func_int **__dest;
  element_type *extraout_RAX;
  ParamGenerator<(anonymous_namespace)::TestVideoParam> PVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  
  impl = (ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam> *)operator_new(0x20);
  impl->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__ValuesInIteratorRangeGenerator_0105c638;
  impl[1]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[2]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[3]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  __dest = (_func_int **)operator_new(0xd8);
  impl[1]._vptr_ParamGeneratorInterface = __dest;
  impl[3]._vptr_ParamGeneratorInterface = __dest + 0x1b;
  memcpy(__dest,::(anonymous_namespace)::kTestVectors,0xd8);
  impl[2]._vptr_ParamGeneratorInterface = __dest + 0x1b;
  internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>::ParamGenerator
            ((ParamGenerator<(anonymous_namespace)::TestVideoParam> *)array,impl);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = extraout_RAX;
  return (ParamGenerator<(anonymous_namespace)::TestVideoParam>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}